

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.h
# Opt level: O2

Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> * __thiscall
COLLADASaxFWL::SourceArrayLoader::
beginArray<COLLADASaxFWL::Source<COLLADASaxFWL::BaseArrayElement<float>,(COLLADASaxFWL::SourceBase::DataType)2>>
          (SourceArrayLoader *this,uint64 count,ParserChar *id)

{
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *this_00;
  
  this_00 = (Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>
             *)operator_new(0xe0);
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>::Source
            (this_00);
  COLLADAFW::ArrayPrimitiveType<float>::allocMemory(&(this_00->mArrayElement).mValuesArray,count,1);
  std::__cxx11::string::_M_assign((string *)&(this_00->super_SourceBase).mId);
  this->mCurrentSoure = (SourceBase *)this_00;
  if (id != (ParserChar *)0x0) {
    std::__cxx11::string::assign((char *)&this->mCurrentArrayId);
  }
  return this_00;
}

Assistant:

SourceType* SourceArrayLoader::beginArray( uint64 count,  const ParserChar* id )
	{
		SourceType* newSource = new SourceType();
		newSource->getArrayElement().getValues().allocMemory((size_t)count);
		newSource->setId(mCurrentSourceId);
		mCurrentSoure = newSource;
		if ( id )
			mCurrentArrayId = id;
		return newSource;
	}